

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

void __thiscall
Signal<std::shared_ptr<Reaction>_>::Emit
          (Signal<std::shared_ptr<Reaction>_> *this,shared_ptr<Reaction> *p)

{
  _Base_ptr p_Var1;
  pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> it;
  __shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> local_58;
  
  for (p_Var1 = (this->slots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->slots_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    std::pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_>::pair
              (&local_58,
               (pair<const_int,_std::function<void_(std::shared_ptr<Reaction>)>_> *)(p_Var1 + 1));
    std::__shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_68,&p->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>);
    std::function<void_(std::shared_ptr<Reaction>)>::operator()
              (&local_58.second,(shared_ptr<Reaction> *)&_Stack_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
    std::_Function_base::~_Function_base(&local_58.second.super__Function_base);
  }
  return;
}

Assistant:

void Emit(Args... p) {
    for (auto it : slots_) {
      it.second(p...);
    }
  }